

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgStatement.cpp
# Opt level: O2

void __thiscall
rsg::ExpressionStatement::ExpressionStatement(ExpressionStatement *this,GeneratorState *state)

{
  Expression *pEVar1;
  ExpressionGenerator generator;
  ExpressionGenerator EStack_f8;
  VariableType local_d8;
  ValueRange local_88;
  
  (this->super_Statement)._vptr_Statement = (_func_int **)&PTR__ExpressionStatement_00c454a8;
  this->m_expression = (Expression *)0x0;
  ExpressionGenerator::ExpressionGenerator(&EStack_f8,state);
  local_d8.m_typeName._M_dataplus._M_p = (pointer)&local_d8.m_typeName.field_2;
  local_d8.m_baseType = TYPE_VOID;
  local_d8.m_precision = PRECISION_NONE;
  local_d8.m_typeName._M_string_length = 0;
  local_d8.m_typeName.field_2._M_local_buf[0] = '\0';
  local_d8.m_numElements = 0;
  local_d8.m_elementType = (VariableType *)0x0;
  local_d8.m_members.
  super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.m_members.
  super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.m_members.
  super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ValueRange::ValueRange(&local_88,&local_d8);
  pEVar1 = ExpressionGenerator::generate(&EStack_f8,&local_88,0);
  this->m_expression = pEVar1;
  ValueRange::~ValueRange(&local_88);
  VariableType::~VariableType(&local_d8);
  ExpressionGenerator::~ExpressionGenerator(&EStack_f8);
  return;
}

Assistant:

ExpressionStatement::ExpressionStatement (GeneratorState& state)
	: m_expression(DE_NULL)
{
	ExpressionGenerator generator(state);
	m_expression = generator.generate(ValueRange(VariableType(VariableType::TYPE_VOID)));
}